

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::GPUConversionDecodeEnabledCase::verifyResult
          (GPUConversionDecodeEnabledCase *this)

{
  TestLog *pTVar1;
  ulong uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  Vector<bool,_4> res;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  undefined8 local_1e8;
  long local_1e0;
  long local_1d8 [2];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1c8;
  Vec4 local_1a8;
  undefined1 local_198 [8];
  _func_int **pp_Stack_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  pTVar1 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels(&this->super_SRGBTestCase,&local_1c8);
  local_198 = (undefined1  [8])local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Expected color: ","");
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 1.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 1.0;
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_198,0,&local_1a8);
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198,local_188[0]._M_allocated_capacity + 1);
  }
  local_198 = (undefined1  [8])0x3f80000000000000;
  pp_Stack_190 = (_func_int **)0x3f80000000000000;
  local_1e8 = (long *)((ulong)local_1e8._4_4_ << 0x20);
  lVar3 = 0;
  do {
    *(bool *)((long)&local_1e8 + lVar3) =
         (local_1c8.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start)->m_data[lVar3] == *(float *)(local_198 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if (local_1e8._0_1_ == (string)0x0) {
    bVar5 = false;
  }
  else {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (uVar4 == 3) break;
      uVar2 = uVar4 + 1;
    } while (*(char *)((long)&local_1e8 + uVar4 + 1) != '\0');
    bVar5 = 2 < uVar4;
  }
  local_198 = (undefined1  [8])pTVar1;
  if (bVar5 == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_190);
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"returned fail color from GPU","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_190,(char *)local_1e8,local_1e0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_190);
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"returned pass color from GPU","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_190,(char *)local_1e8,local_1e0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_190);
  std::ios_base::~ios_base(local_120);
  if (local_1c8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool GPUConversionDecodeEnabledCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);
	this->logColor(std::string("Expected color: "), resultColorIdx, getColorGreenPass());

	// result color returned from GPU is either green (pass) or fail (red)
	if ( tcu::boolAll(tcu::equal(pixelResultList[resultColorIdx], getColorGreenPass())) )
	{
		log << tcu::TestLog::Message << std::string("returned pass color from GPU") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("returned fail color from GPU") << tcu::TestLog::EndMessage;
		return false;
	}
}